

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O3

ParameterError getstrn(char **str,char *val,size_t len,_Bool allowblank)

{
  char *__dest;
  ParameterError PVar1;
  
  if (*str != (char *)0x0) {
    free(*str);
    *str = (char *)0x0;
  }
  PVar1 = PARAM_OK;
  if (val != (char *)0x0) {
    __dest = (char *)malloc(len + 1);
    *str = __dest;
    if (__dest == (char *)0x0) {
      PVar1 = PARAM_NO_MEM;
    }
    else {
      memcpy(__dest,val,len);
      __dest[len] = '\0';
      PVar1 = PARAM_OK;
    }
  }
  return PVar1;
}

Assistant:

static ParameterError getstrn(char **str, const char *val,
                              size_t len, bool allowblank)
{
  if(*str) {
    free(*str);
    *str = NULL;
  }
  if(val) {
    if(!allowblank && !val[0])
      return PARAM_BLANK_STRING;

    *str = malloc(len + 1);
    if(!*str)
      return PARAM_NO_MEM;

    memcpy(*str, val, len);
    (*str)[len] = 0; /* null terminate */
  }
  return PARAM_OK;
}